

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O3

void * prepend_alloc(mstate m,char *newbase,char *oldbase,size_t nb)

{
  mchunkptr pmVar1;
  long *plVar2;
  malloc_tree_chunk *pmVar3;
  malloc_tree_chunk *pmVar4;
  tbinptr pmVar5;
  tbinptr pmVar6;
  malloc_chunk *pmVar7;
  byte bVar8;
  long lVar9;
  malloc_tree_chunk **ppmVar10;
  uint uVar11;
  malloc_tree_chunk **ppmVar12;
  uint uVar13;
  ulong uVar14;
  malloc_chunk *pmVar15;
  ulong uVar16;
  tbinptr pmVar17;
  tbinptr pmVar18;
  long lVar19;
  ulong uVar20;
  
  uVar20 = (ulong)(-(int)newbase - 0x10U & 0xf);
  pmVar17 = (tbinptr)(oldbase + (-(int)oldbase - 0x10U & 0xf));
  pmVar1 = (mchunkptr)(newbase + nb + uVar20);
  uVar16 = (long)pmVar17 - (long)pmVar1;
  *(size_t *)(newbase + uVar20 + 8) = nb | 3;
  if (pmVar17 == (tbinptr)m->top) {
    uVar16 = uVar16 + m->topsize;
    m->topsize = uVar16;
    m->top = pmVar1;
    pmVar1->head = uVar16 | 1;
    goto LAB_001314cf;
  }
  if (pmVar17 == (tbinptr)m->dv) {
    uVar16 = uVar16 + m->dvsize;
    m->dvsize = uVar16;
    m->dv = pmVar1;
    pmVar1->head = uVar16 | 1;
    *(ulong *)((long)pmVar1 + uVar16) = uVar16;
    goto LAB_001314cf;
  }
  uVar14 = pmVar17->head;
  pmVar18 = pmVar17;
  if (((uint)uVar14 & 3) == 1) {
    if (uVar14 < 0x100) {
      pmVar3 = pmVar17->fd;
      pmVar4 = pmVar17->bk;
      if ((pmVar3 != (malloc_tree_chunk *)(m->smallbins + (uVar14 >> 3) * 2)) &&
         ((pmVar3 < (malloc_tree_chunk *)m->least_addr || (pmVar3->bk != pmVar17))))
      goto LAB_001314e3;
      if (pmVar4 == pmVar3) {
        bVar8 = (byte)(uVar14 >> 3) & 0x1f;
        m->smallmap = m->smallmap & (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8);
      }
      else {
        if ((pmVar4 != (malloc_tree_chunk *)(m->smallbins + (uVar14 >> 3) * 2)) &&
           ((pmVar4 < (malloc_tree_chunk *)m->least_addr || (pmVar4->fd != pmVar17))))
        goto LAB_001314e3;
        pmVar3->bk = pmVar4;
        pmVar4->fd = pmVar3;
      }
    }
    else {
      pmVar18 = pmVar17->bk;
      pmVar3 = pmVar17->child[2];
      if (pmVar18 == pmVar17) {
        if (pmVar17->child[1] == (tbinptr)0x0) {
          if (pmVar17->child[0] == (tbinptr)0x0) {
            pmVar18 = (tbinptr)0x0;
            goto LAB_001312b7;
          }
          pmVar5 = pmVar17->child[0];
          ppmVar10 = pmVar17->child;
        }
        else {
          pmVar5 = pmVar17->child[1];
          ppmVar10 = pmVar17->child + 1;
        }
        do {
          do {
            ppmVar12 = ppmVar10;
            pmVar18 = pmVar5;
            pmVar5 = pmVar18->child[1];
            ppmVar10 = pmVar18->child + 1;
          } while (pmVar18->child[1] != (malloc_tree_chunk *)0x0);
          pmVar5 = pmVar18->child[0];
          ppmVar10 = pmVar18->child;
        } while (pmVar18->child[0] != (malloc_tree_chunk *)0x0);
        if (ppmVar12 < m->least_addr) goto LAB_001314e3;
        *ppmVar12 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar4 = pmVar17->fd;
        if (((pmVar4 < (malloc_tree_chunk *)m->least_addr) || (pmVar4->bk != pmVar17)) ||
           (pmVar18->fd != pmVar17)) goto LAB_001314e3;
        pmVar4->bk = pmVar18;
        pmVar18->fd = pmVar4;
      }
LAB_001312b7:
      if (pmVar3 != (malloc_tree_chunk *)0x0) {
        uVar13 = *(uint *)(pmVar17->child + 3);
        if (pmVar17 == m->treebins[uVar13]) {
          m->treebins[uVar13] = pmVar18;
          if (pmVar18 == (tbinptr)0x0) {
            bVar8 = (byte)uVar13 & 0x1f;
            m->treemap = m->treemap & (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8);
          }
          else {
LAB_001312fa:
            pmVar5 = (tbinptr)m->least_addr;
            if (pmVar18 < pmVar5) goto LAB_001314e3;
            pmVar18->child[2] = pmVar3;
            pmVar6 = pmVar17->child[0];
            if (pmVar6 != (tbinptr)0x0) {
              if (pmVar6 < pmVar5) goto LAB_001314e3;
              pmVar18->child[0] = pmVar6;
              pmVar6->child[2] = pmVar18;
            }
            pmVar3 = pmVar17->child[1];
            if (pmVar3 != (malloc_tree_chunk *)0x0) {
              if (pmVar3 < (malloc_tree_chunk *)m->least_addr) goto LAB_001314e3;
              pmVar18->child[1] = pmVar3;
              pmVar3->parent = pmVar18;
            }
          }
        }
        else {
          if (pmVar3 < (malloc_tree_chunk *)m->least_addr) goto LAB_001314e3;
          pmVar3->child[pmVar3->child[0] != pmVar17] = pmVar18;
          if (pmVar18 != (tbinptr)0x0) goto LAB_001312fa;
        }
      }
    }
    uVar14 = uVar14 & 0xfffffffffffffff8;
    pmVar18 = (tbinptr)((long)pmVar17->child + (uVar14 - 0x20));
    uVar16 = uVar16 + uVar14;
    uVar14 = *(ulong *)((long)pmVar17->child + (uVar14 - 0x18));
  }
  pmVar18->head = uVar14 & 0xfffffffffffffffe;
  pmVar1->head = uVar16 | 1;
  *(ulong *)((long)&pmVar1->prev_foot + uVar16) = uVar16;
  if (uVar16 < 0x100) {
    pmVar7 = (malloc_chunk *)(m->smallbins + (uVar16 >> 3) * 2);
    uVar13 = (uint)(uVar16 >> 3);
    if ((m->smallmap >> (uVar13 & 0x1f) & 1) == 0) {
      m->smallmap = m->smallmap | 1 << (uVar13 & 0x1f);
      pmVar15 = pmVar7;
    }
    else {
      pmVar15 = pmVar7->fd;
      if (pmVar7->fd < (malloc_chunk *)m->least_addr) {
LAB_001314e3:
        abort();
      }
    }
    pmVar7->fd = pmVar1;
    pmVar15->bk = pmVar1;
    pmVar1->fd = pmVar15;
    pmVar1->bk = pmVar7;
  }
  else {
    uVar13 = (uint)(uVar16 >> 8);
    if (uVar13 == 0) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0x1f;
      if (uVar13 < 0x10000) {
        uVar11 = ((uint)(uVar16 >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar13)) & 0x3f)) & 1) +
                 LZCOUNT(uVar13) * 2 ^ 0x3e;
      }
    }
    *(uint *)&pmVar1[1].bk = uVar11;
    pmVar7 = (malloc_chunk *)(m->treebins + uVar11);
    pmVar1[1].prev_foot = 0;
    pmVar1[1].head = 0;
    if ((m->treemap >> (uVar11 & 0x1f) & 1) == 0) {
      m->treemap = m->treemap | 1 << (uVar11 & 0x1f);
      pmVar7->prev_foot = (size_t)pmVar1;
      pmVar1[1].fd = pmVar7;
    }
    else {
      uVar14 = (ulong)(byte)(0x39 - (char)(uVar11 >> 1));
      if (uVar11 == 0x1f) {
        uVar14 = 0;
      }
      lVar19 = uVar16 << (uVar14 & 0x3f);
      pmVar7 = (malloc_chunk *)pmVar7->prev_foot;
      do {
        pmVar15 = pmVar7;
        if ((pmVar15->head & 0xfffffffffffffff8) == uVar16) {
          if ((pmVar15 < (malloc_chunk *)m->least_addr) ||
             (pmVar7 = pmVar15->fd, pmVar7 < (malloc_chunk *)m->least_addr)) goto LAB_001314e3;
          pmVar7->bk = pmVar1;
          pmVar15->fd = pmVar1;
          pmVar1->fd = pmVar7;
          pmVar1->bk = pmVar15;
          pmVar1[1].fd = (malloc_chunk *)0x0;
          goto LAB_001314cf;
        }
        lVar9 = lVar19 >> 0x3f;
        lVar19 = lVar19 * 2;
        pmVar7 = *(malloc_chunk **)((long)pmVar15 + lVar9 * -8 + 0x20);
      } while (pmVar7 != (malloc_chunk *)0x0);
      plVar2 = (long *)((long)pmVar15 + lVar9 * -8 + 0x20);
      if (plVar2 < m->least_addr) goto LAB_001314e3;
      *plVar2 = (long)pmVar1;
      pmVar1[1].fd = pmVar15;
    }
    pmVar1->bk = pmVar1;
    pmVar1->fd = pmVar1;
  }
LAB_001314cf:
  return newbase + uVar20 + 0x10;
}

Assistant:

static void* prepend_alloc(mstate m, char* newbase, char* oldbase,
                           size_t nb) {
  mchunkptr p = align_as_chunk(newbase);
  mchunkptr oldfirst = align_as_chunk(oldbase);
  size_t psize = (char*)oldfirst - (char*)p;
  mchunkptr q = chunk_plus_offset(p, nb);
  size_t qsize = psize - nb;
  set_size_and_pinuse_of_inuse_chunk(m, p, nb);

  assert((char*)oldfirst > (char*)q);
  assert(pinuse(oldfirst));
  assert(qsize >= MIN_CHUNK_SIZE);

  /* consolidate remainder with first chunk of old base */
  if (oldfirst == m->top) {
    size_t tsize = m->topsize += qsize;
    m->top = q;
    q->head = tsize | PINUSE_BIT;
    check_top_chunk(m, q);
  }
  else if (oldfirst == m->dv) {
    size_t dsize = m->dvsize += qsize;
    m->dv = q;
    set_size_and_pinuse_of_free_chunk(q, dsize);
  }
  else {
    if (!is_inuse(oldfirst)) {
      size_t nsize = chunksize(oldfirst);
      unlink_chunk(m, oldfirst, nsize);
      oldfirst = chunk_plus_offset(oldfirst, nsize);
      qsize += nsize;
    }
    set_free_with_pinuse(q, qsize, oldfirst);
    insert_chunk(m, q, qsize);
    check_free_chunk(m, q);
  }

  check_malloced_chunk(m, chunk2mem(p), nb);
  return chunk2mem(p);
}